

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_EditionDefaults_Test::TestBody
          (CommandLineInterfaceTest_EditionDefaults_Test *this)

{
  char *message;
  string_view name;
  Metadata MVar1;
  string_view filename;
  string_view contents;
  FeatureSetDefaults defaults;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  char local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  FeatureSetDefaults local_50;
  
  MVar1 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_((string *)&local_50,(MVar1.descriptor)->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = (char *)local_50.super_Message.super_MessageLite._vptr_MessageLite;
  contents._M_len = local_50.super_Message.super_MessageLite._internal_metadata_.ptr_;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  if ((anon_union_40_1_493b367e_for_FeatureSetDefaults_3 *)
      local_50.super_Message.super_MessageLite._vptr_MessageLite != &local_50.field_0) {
    operator_delete(local_50.super_Message.super_MessageLite._vptr_MessageLite,
                    local_50.field_0._0_8_ + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "protocol_compiler --proto_path=$tmpdir --edition_defaults_out=$tmpdir/defaults google/protobuf/descriptor.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  filename._M_str = "defaults";
  filename._M_len = 8;
  CommandLineInterfaceTest::ReadEditionDefaults
            (&local_50,&this->super_CommandLineInterfaceTest,filename);
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1195e21;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_80,(char *)&local_90,(FeatureSetDefaults *)0x1198111);
  if (local_80[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x80c,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  FeatureSetDefaults::~FeatureSetDefaults(&local_50);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaults) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_out=$tmpdir/defaults "
      "google/protobuf/descriptor.proto");
  ExpectNoErrors();

  FeatureSetDefaults defaults = ReadEditionDefaults("defaults");
  EXPECT_THAT(defaults, EqualsProto(R"pb(
                defaults {
                  edition: EDITION_LEGACY
                  overridable_features {}
                  fixed_features {
                    field_presence: EXPLICIT
                    enum_type: CLOSED
                    repeated_field_encoding: EXPANDED
                    utf8_validation: NONE
                    message_encoding: LENGTH_PREFIXED
                    json_format: LEGACY_BEST_EFFORT
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                defaults {
                  edition: EDITION_PROTO3
                  overridable_features {}
                  fixed_features {
                    field_presence: IMPLICIT
                    enum_type: OPEN
                    repeated_field_encoding: PACKED
                    utf8_validation: VERIFY
                    message_encoding: LENGTH_PREFIXED
                    json_format: ALLOW
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                defaults {
                  edition: EDITION_2023
                  overridable_features {
                    field_presence: EXPLICIT
                    enum_type: OPEN
                    repeated_field_encoding: PACKED
                    utf8_validation: VERIFY
                    message_encoding: LENGTH_PREFIXED
                    json_format: ALLOW
                  }
                  fixed_features {
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                minimum_edition: EDITION_PROTO2
                maximum_edition: EDITION_2023
              )pb"));
}